

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressBlock_splitBlock_internal
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t blockSize,
                 U32 lastBlock,U32 nbSeq)

{
  ZSTD_compressedBlockState_t *pZVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t err_code_1;
  U32 lastBlockEntireSrc;
  U32 lastPartition;
  size_t cSizeChunk;
  size_t srcBytes;
  size_t err_code;
  size_t cSizeSingleBlock;
  repcodes_t cRep;
  repcodes_t dRep;
  seqStore_t currSeqStore;
  seqStore_t nextSeqStore;
  size_t numSplits;
  size_t srcBytesTotal;
  size_t i;
  U32 partitions [196];
  void *local_60;
  BYTE *op;
  BYTE *ip;
  size_t cSize;
  U32 lastBlock_local;
  size_t blockSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *zc_local;
  
  ip = (BYTE *)0x0;
  numSplits = 0;
  sVar3 = ZSTD_deriveBlockSplits(zc,(U32 *)&i,nbSeq);
  pZVar1 = (zc->blockState).prevCBlock;
  cRep.rep._4_8_ = *(undefined8 *)pZVar1->rep;
  dRep.rep[0] = pZVar1->rep[2];
  pZVar1 = (zc->blockState).prevCBlock;
  cSizeSingleBlock = *(size_t *)pZVar1->rep;
  cRep.rep[0] = pZVar1->rep[2];
  if (sVar3 == 0) {
    zc_local = (ZSTD_CCtx *)
               ZSTD_compressSeqStore_singleBlock
                         (zc,&zc->seqStore,(repcodes_t *)(cRep.rep + 1),
                          (repcodes_t *)&cSizeSingleBlock,dst,dstCapacity,src,blockSize,lastBlock,0)
    ;
    ERR_isError((size_t)zc_local);
  }
  else {
    ZSTD_deriveSeqStoreChunk((seqStore_t *)(dRep.rep + 1),&zc->seqStore,0,(ulong)(uint)i);
    local_60 = dst;
    op = (BYTE *)src;
    src_local = (void *)dstCapacity;
    for (srcBytesTotal = 0; srcBytesTotal <= sVar3; srcBytesTotal = srcBytesTotal + 1) {
      err_code_1._0_4_ = 0;
      sVar4 = ZSTD_countSeqStoreLiteralsBytes((seqStore_t *)(dRep.rep + 1));
      sVar5 = ZSTD_countSeqStoreMatchBytes((seqStore_t *)(dRep.rep + 1));
      cSizeChunk = sVar4 + sVar5;
      numSplits = cSizeChunk + numSplits;
      if (srcBytesTotal == sVar3) {
        cSizeChunk = (blockSize - numSplits) + cSizeChunk;
        err_code_1._0_4_ = lastBlock;
      }
      else {
        ZSTD_deriveSeqStoreChunk
                  ((seqStore_t *)&currSeqStore.longLengthType,&zc->seqStore,
                   (ulong)partitions[srcBytesTotal - 2],(ulong)partitions[srcBytesTotal - 1]);
      }
      sVar4 = ZSTD_compressSeqStore_singleBlock
                        (zc,(seqStore_t *)(dRep.rep + 1),(repcodes_t *)(cRep.rep + 1),
                         (repcodes_t *)&cSizeSingleBlock,local_60,(size_t)src_local,op,cSizeChunk,
                         (U32)err_code_1,1);
      uVar2 = ERR_isError(sVar4);
      if (uVar2 != 0) {
        return sVar4;
      }
      op = op + cSizeChunk;
      local_60 = (void *)(sVar4 + (long)local_60);
      src_local = (void *)((long)src_local - sVar4);
      ip = ip + sVar4;
      memcpy(dRep.rep + 1,&currSeqStore.longLengthType,0x50);
    }
    pZVar1 = (zc->blockState).prevCBlock;
    *(undefined8 *)pZVar1->rep = cRep.rep._4_8_;
    pZVar1->rep[2] = dRep.rep[0];
    zc_local = (ZSTD_CCtx *)ip;
  }
  return (size_t)zc_local;
}

Assistant:

static size_t ZSTD_compressBlock_splitBlock_internal(ZSTD_CCtx* zc, void* dst, size_t dstCapacity,
                                                     const void* src, size_t blockSize, U32 lastBlock, U32 nbSeq) {
    size_t cSize = 0;
    const BYTE* ip = (const BYTE*)src;
    BYTE* op = (BYTE*)dst;
    U32 partitions[MAX_NB_SPLITS];
    size_t i = 0;
    size_t srcBytesTotal = 0;
    size_t numSplits = ZSTD_deriveBlockSplits(zc, partitions, nbSeq);
    seqStore_t nextSeqStore;
    seqStore_t currSeqStore;

    /* If a block is split and some partitions are emitted as RLE/uncompressed, then repcode history
     * may become invalid. In order to reconcile potentially invalid repcodes, we keep track of two
     * separate repcode histories that simulate repcode history on compression and decompression side,
     * and use the histories to determine whether we must replace a particular repcode with its raw offset.
     *
     * 1) cRep gets updated for each partition, regardless of whether the block was emitted as uncompressed
     *    or RLE. This allows us to retrieve the offset value that an invalid repcode references within
     *    a nocompress/RLE block.
     * 2) dRep gets updated only for compressed partitions, and when a repcode gets replaced, will use
     *    the replacement offset value rather than the original repcode to update the repcode history.
     *    dRep also will be the final repcode history sent to the next block.
     *
     * See ZSTD_seqStore_resolveOffCodes() for more details.
     */
    repcodes_t dRep;
    repcodes_t cRep;
    ZSTD_memcpy(dRep.rep, zc->blockState.prevCBlock->rep, sizeof(repcodes_t));
    ZSTD_memcpy(cRep.rep, zc->blockState.prevCBlock->rep, sizeof(repcodes_t));

    DEBUGLOG(4, "ZSTD_compressBlock_splitBlock_internal (dstCapacity=%u, dictLimit=%u, nextToUpdate=%u)",
                (unsigned)dstCapacity, (unsigned)zc->blockState.matchState.window.dictLimit,
                (unsigned)zc->blockState.matchState.nextToUpdate);

    if (numSplits == 0) {
        size_t cSizeSingleBlock = ZSTD_compressSeqStore_singleBlock(zc, &zc->seqStore,
                                                                   &dRep, &cRep,
                                                                    op, dstCapacity,
                                                                    ip, blockSize,
                                                                    lastBlock, 0 /* isPartition */);
        FORWARD_IF_ERROR(cSizeSingleBlock, "Compressing single block from splitBlock_internal() failed!");
        DEBUGLOG(5, "ZSTD_compressBlock_splitBlock_internal: No splits");
        assert(cSizeSingleBlock <= ZSTD_BLOCKSIZE_MAX + ZSTD_blockHeaderSize);
        return cSizeSingleBlock;
    }

    ZSTD_deriveSeqStoreChunk(&currSeqStore, &zc->seqStore, 0, partitions[0]);
    for (i = 0; i <= numSplits; ++i) {
        size_t srcBytes;
        size_t cSizeChunk;
        U32 const lastPartition = (i == numSplits);
        U32 lastBlockEntireSrc = 0;

        srcBytes = ZSTD_countSeqStoreLiteralsBytes(&currSeqStore) + ZSTD_countSeqStoreMatchBytes(&currSeqStore);
        srcBytesTotal += srcBytes;
        if (lastPartition) {
            /* This is the final partition, need to account for possible last literals */
            srcBytes += blockSize - srcBytesTotal;
            lastBlockEntireSrc = lastBlock;
        } else {
            ZSTD_deriveSeqStoreChunk(&nextSeqStore, &zc->seqStore, partitions[i], partitions[i+1]);
        }

        cSizeChunk = ZSTD_compressSeqStore_singleBlock(zc, &currSeqStore,
                                                      &dRep, &cRep,
                                                       op, dstCapacity,
                                                       ip, srcBytes,
                                                       lastBlockEntireSrc, 1 /* isPartition */);
        DEBUGLOG(5, "Estimated size: %zu actual size: %zu", ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(&currSeqStore, zc), cSizeChunk);
        FORWARD_IF_ERROR(cSizeChunk, "Compressing chunk failed!");

        ip += srcBytes;
        op += cSizeChunk;
        dstCapacity -= cSizeChunk;
        cSize += cSizeChunk;
        currSeqStore = nextSeqStore;
        assert(cSizeChunk <= ZSTD_BLOCKSIZE_MAX + ZSTD_blockHeaderSize);
    }
    /* cRep and dRep may have diverged during the compression. If so, we use the dRep repcodes
     * for the next block.
     */
    ZSTD_memcpy(zc->blockState.prevCBlock->rep, dRep.rep, sizeof(repcodes_t));
    return cSize;
}